

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rehash(Hash *pH,uint new_size)

{
  HashElem *pHVar1;
  int iVar2;
  uint uVar3;
  _ht *p;
  uint uVar4;
  uint h;
  HashElem *next_elem;
  HashElem *elem;
  _ht *new_ht;
  uint new_size_local;
  Hash *pH_local;
  
  new_ht._4_4_ = new_size;
  if (0x40 < new_size) {
    new_ht._4_4_ = 0x40;
  }
  if (new_ht._4_4_ == pH->htsize) {
    pH_local._4_4_ = 0;
  }
  else {
    sqlite3BeginBenignMalloc();
    p = (_ht *)sqlite3Malloc((ulong)new_ht._4_4_ << 4);
    sqlite3EndBenignMalloc();
    if (p == (_ht *)0x0) {
      pH_local._4_4_ = 0;
    }
    else {
      sqlite3_free(pH->ht);
      pH->ht = p;
      iVar2 = sqlite3MallocSize(p);
      uVar4 = (uint)((ulong)(long)iVar2 >> 4);
      pH->htsize = uVar4;
      memset(p,0,((ulong)(long)iVar2 >> 4 & 0xffffffff) << 4);
      next_elem = pH->first;
      pH->first = (HashElem *)0x0;
      while (next_elem != (HashElem *)0x0) {
        uVar3 = strHash(next_elem->pKey);
        pHVar1 = next_elem->next;
        insertElement(pH,p + uVar3 % uVar4,next_elem);
        next_elem = pHVar1;
      }
      pH_local._4_4_ = 1;
    }
  }
  return pH_local._4_4_;
}

Assistant:

static int rehash(Hash *pH, unsigned int new_size){
  struct _ht *new_ht;            /* The new hash table */
  HashElem *elem, *next_elem;    /* For looping over existing elements */

#if SQLITE_MALLOC_SOFT_LIMIT>0
  if( new_size*sizeof(struct _ht)>SQLITE_MALLOC_SOFT_LIMIT ){
    new_size = SQLITE_MALLOC_SOFT_LIMIT/sizeof(struct _ht);
  }
  if( new_size==pH->htsize ) return 0;
#endif

  /* The inability to allocates space for a larger hash table is
  ** a performance hit but it is not a fatal error.  So mark the
  ** allocation as a benign. Use sqlite3Malloc()/memset(0) instead of
  ** sqlite3MallocZero() to make the allocation, as sqlite3MallocZero()
  ** only zeroes the requested number of bytes whereas this module will
  ** use the actual amount of space allocated for the hash table (which
  ** may be larger than the requested amount).
  */
  sqlite3BeginBenignMalloc();
  new_ht = (struct _ht *)sqlite3Malloc( new_size*sizeof(struct _ht) );
  sqlite3EndBenignMalloc();

  if( new_ht==0 ) return 0;
  sqlite3_free(pH->ht);
  pH->ht = new_ht;
  pH->htsize = new_size = sqlite3MallocSize(new_ht)/sizeof(struct _ht);
  memset(new_ht, 0, new_size*sizeof(struct _ht));
  for(elem=pH->first, pH->first=0; elem; elem = next_elem){
    unsigned int h = strHash(elem->pKey) % new_size;
    next_elem = elem->next;
    insertElement(pH, &new_ht[h], elem);
  }
  return 1;
}